

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinTrace
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  HeapEntity *pHVar2;
  anon_union_8_3_4e909c26_for_v aVar3;
  undefined4 uVar4;
  ostream *poVar5;
  RuntimeError *__return_storage_ptr__;
  Type t;
  string str;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1->t == STRING) {
    pHVar2 = (pVVar1->v).h;
    encode_utf8((string *)local_1b0,(internal *)pHVar2[1]._vptr_HeapEntity,
                *(UString **)&pHVar2[1].mark);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"TRACE: ",7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(loc->file)._M_dataplus._M_p,
                        (loc->file)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_1b0._0_8_,local_1b0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pVVar1 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined4 *)&pVVar1[1].field_0x4;
    aVar3 = pVVar1[1].v;
    (this->scratch).t = pVVar1[1].t;
    *(undefined4 *)&(this->scratch).field_0x4 = uVar4;
    (this->scratch).v = aVar3;
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    return (AST *)0x0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  poVar5 = (ostream *)(local_1b0 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"Builtin function trace expected string as first parameter but ",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"got ",4);
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_1d0,
             (_anonymous_namespace_ *)
             (ulong)((args->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                     )._M_impl.super__Vector_impl_data._M_start)->t,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,&local_1d0);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinTrace(const LocationRange &loc, const std::vector<Value> &args)
    {
        if(args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "Builtin function trace expected string as first parameter but "
               << "got " << type_str(args[0].t);
            throw makeError(loc, ss.str());
        }

        std::string str = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);
        std::cerr << "TRACE: " << loc.file << ":" << loc.begin.line << " " <<  str
            << std::endl;

        scratch = args[1];
        return nullptr;
    }